

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::unwrap(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Sys *this,Token *token)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  undefined4 extraout_var_00;
  HttpResponse *pHVar4;
  optional<Vault::HttpResponse> local_180;
  allocator<char> local_129;
  string local_128 [32];
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  Url local_90;
  undefined1 local_70 [8];
  optional<Vault::HttpResponse> response;
  Token *token_local;
  Sys *this_local;
  
  response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
  super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::HttpResponse>._72_8_ = token;
  iVar3 = (*this->client_->_vptr_Client[10])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"wrapping/unwrap",&local_d1);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_b0,&local_d0);
  getUrl(&local_90,this,&local_b0);
  uVar1 = response.super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
          super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
          super__Optional_payload_base<Vault::HttpResponse>._72_8_;
  (*this->client_->_vptr_Client[9])(&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"",&local_129);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
            (local_70,(long *)CONCAT44(extraout_var,iVar3),&local_90,uVar1,&local_108,local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_108);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_90);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::optional<Vault::HttpResponse>::optional(&local_180,(optional<Vault::HttpResponse> *)local_70)
  ;
  bVar2 = HttpClient::is_success(&local_180);
  std::optional<Vault::HttpResponse>::~optional(&local_180);
  if (bVar2) {
    pHVar4 = std::optional<Vault::HttpResponse>::value((optional<Vault::HttpResponse> *)local_70);
    __t = Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value(&pHVar4->body);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (__return_storage_ptr__,__t);
  }
  else {
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_70);
    if (bVar2) {
      iVar3 = (*this->client_->_vptr_Client[10])();
      pHVar4 = std::optional<Vault::HttpResponse>::value((optional<Vault::HttpResponse> *)local_70);
      HttpClient::handleResponseError((HttpClient *)CONCAT44(extraout_var_00,iVar3),pHVar4);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  std::optional<Vault::HttpResponse>::~optional((optional<Vault::HttpResponse> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::unwrap(const Token &token) {
  auto response = client_.getHttpClient().post(
      getUrl(Path{"wrapping/unwrap"}), token, client_.getNamespace(), "");

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client_.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}